

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,hex_writer f)

{
  ulong uVar1;
  char *in_stack_ffffffffffffffa8;
  uint uVar2;
  byte bStack_47;
  char cStack_46;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<int,_fmt::v6::basic_format_specs<char>_>::hex_writer>
  local_40;
  
  local_40.prefix.size_ = prefix.size_;
  local_40.prefix.data_ = prefix.data_;
  if (num_digits < 0) {
LAB_00137b7b:
    assert_fail(specs._0_8_,0,in_stack_ffffffffffffffa8);
  }
  local_40.size_ = (uint)num_digits + local_40.prefix.size_;
  bStack_47 = specs._9_1_;
  cStack_46 = specs.fill.data_[0];
  if ((bStack_47 & 0xf) == 4) {
    uVar1 = (ulong)specs.width;
    if ((long)uVar1 < 0) goto LAB_00137b7b;
    local_40.padding = 0;
    if (local_40.size_ <= uVar1) {
      local_40.padding = uVar1 - local_40.size_;
      local_40.size_ = uVar1;
    }
  }
  else {
    uVar2 = specs.precision;
    if (num_digits < (int)uVar2) {
      if (((int)uVar2 < 0) || ((int)(uVar2 - num_digits) < 0)) goto LAB_00137b7b;
      cStack_46 = '0';
      local_40.padding = (ulong)(uVar2 - num_digits);
      local_40.size_ = uVar2 + local_40.prefix.size_;
    }
    else {
      local_40.padding = 0;
    }
  }
  local_40.f.self = f.self;
  local_40.f.num_digits = f.num_digits;
  local_40.fill = cStack_46;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::hex_writer>>
            (this,(format_specs *)&stack0xffffffffffffffb0,&local_40);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }